

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void dlib::
     hsort_array<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,dlib::open_file_box_helper::case_insensitive_compare>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *array,unsigned_long left,unsigned_long right,case_insensitive_compare *comp)

{
  reference b;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  case_insensitive_compare *in_RDI;
  unsigned_long unaff_retaddr;
  unsigned_long i_1;
  unsigned_long i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  
  if ((ulong)((long)in_RDX - (long)in_RSI) < 0x1e) {
    isort_array<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,dlib::open_file_box_helper::case_insensitive_compare>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)i,i_1,unaff_retaddr,in_RDI);
  }
  else {
    for (local_28 = in_RSI + ((ulong)((long)in_RDX - (long)in_RSI) >> 1);
        sort_helpers::
        heapify<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,dlib::open_file_box_helper::case_insensitive_compare>
                  (array,left,right,(unsigned_long)comp,(case_insensitive_compare *)i),
        local_28 != in_RSI; local_28 = local_28 + -1) {
    }
    while (in_RSI < in_RDX) {
      b = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_RDI,(size_type)in_RDX);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RDI,(size_type)in_RSI);
      exchange<std::__cxx11::string>(in_RDX,b);
      in_RDX = in_RDX + -1;
      sort_helpers::
      heapify<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,dlib::open_file_box_helper::case_insensitive_compare>
                (array,left,right,(unsigned_long)comp,(case_insensitive_compare *)i);
    }
  }
  return;
}

Assistant:

void hsort_array (
        T& array,
        const unsigned long left,
        const unsigned long right,
        const compare& comp
    )
    {
        DLIB_ASSERT (left <= right,
                "\tvoid hsort_array()"
                << "\n\tleft:          " << left
                << "\n\tright:         " << right );

        if (right-left < 30)
        {
            isort_array(array,left,right,comp);
            return;
        }

        // turn array into a max heap
        for (unsigned long i = left+((right-left)>>1);; --i)
        {
            sort_helpers::heapify(array,left,right,i,comp);
            if (i == left)
                break;
        }

        // now sort the array
        for (unsigned long i = right; i > left;)
        {
            exchange(array[i],array[left]);
            sort_helpers::heapify(array,left,--i,left,comp);
        }
    }